

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O1

int lws_service_flag_pending(lws_context *context,int tsi)

{
  ushort uVar1;
  pollfd *ppVar2;
  bool bVar3;
  uint uVar4;
  lws_dll2 *plVar5;
  uint uVar6;
  long lVar7;
  ushort uVar8;
  
  if (context == (lws_context *)0x0) {
    return 1;
  }
  plVar5 = (lws_dll2 *)(context->pt + tsi);
  uVar6 = 0;
  do {
    plVar5 = plVar5->next;
    if (plVar5 == (lws_dll2 *)0x0) break;
    if ((*(char *)&plVar5[0x18].owner == '\0') &&
       (*(short *)((long)&plVar5[0x16].next + 4) != 0x110)) {
      uVar6 = 1;
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
  } while (bVar3);
  uVar4 = rops_service_flag_pending_ws(context,tsi);
  uVar4 = uVar4 | uVar6;
  plVar5 = context->pt[tsi].tls.dll_pending_tls_owner.head;
  while (plVar5 != (lws_dll2 *)0x0) {
    lVar7 = (long)*(int *)((long)&plVar5[4].prev + 4);
    plVar5 = plVar5->next;
    if (-1 < lVar7) {
      ppVar2 = context->pt[tsi].fds;
      uVar8 = ppVar2[lVar7].events & 1;
      uVar1 = ppVar2[lVar7].revents;
      ppVar2[lVar7].revents = uVar8 | uVar1;
      if (uVar8 != 0 || (uVar1 & 1) != 0) {
        uVar4 = 1;
      }
    }
  }
  return uVar4;
}

Assistant:

int
lws_service_flag_pending(struct lws_context *context, int tsi)
{
	struct lws_context_per_thread *pt;
	int forced = 0;

	if (!context)
		return 1;

	pt = &context->pt[tsi];

	lws_pt_lock(pt, __func__);

	/*
	 * 1) If there is any wsi with a buflist and in a state to process
	 *    it, we should not wait in poll
	 */

	lws_start_foreach_dll(struct lws_dll2 *, d, pt->dll_buflist_owner.head) {
		struct lws *wsi = lws_container_of(d, struct lws, dll_buflist);

		if (!lws_is_flowcontrolled(wsi) &&
		     lwsi_state(wsi) != LRS_DEFERRING_ACTION) {
			forced = 1;
			break;
		}
	} lws_end_foreach_dll(d);

#if defined(LWS_ROLE_WS)
	forced |= lws_rops_func_fidx(&role_ops_ws,
				     LWS_ROPS_service_flag_pending).
					service_flag_pending(context, tsi);
#endif

#if defined(LWS_WITH_TLS)
	/*
	 * 2) For all guys with buffered SSL read data already saved up, if they
	 * are not flowcontrolled, fake their POLLIN status so they'll get
	 * service to use up the buffered incoming data, even though their
	 * network socket may have nothing
	 */
	lws_start_foreach_dll_safe(struct lws_dll2 *, p, p1,
			lws_dll2_get_head(&pt->tls.dll_pending_tls_owner)) {
		struct lws *wsi = lws_container_of(p, struct lws,
						   tls.dll_pending_tls);

		if (wsi->position_in_fds_table >= 0) {

			pt->fds[wsi->position_in_fds_table].revents = (short)(
					pt->fds[wsi->position_in_fds_table].revents |
				(pt->fds[wsi->position_in_fds_table].events &
								LWS_POLLIN));
			if (pt->fds[wsi->position_in_fds_table].revents &
								LWS_POLLIN)
				/*
				 * We're not going to remove the wsi from the
				 * pending tls list.  The processing will have
				 * to do it if he exhausts the pending tls.
				 */
				forced = 1;
		}

	} lws_end_foreach_dll_safe(p, p1);
#endif

	lws_pt_unlock(pt);

	return forced;
}